

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_sse_on_message(fio_msg_s *msg)

{
  void *pvVar1;
  void *pvVar2;
  fio_protocol_s *pr;
  int *piVar3;
  
  pvVar1 = msg->udata1;
  pvVar2 = msg->udata2;
  pr = fio_protocol_try_lock(*(intptr_t *)((long)pvVar1 + 0x28),FIO_PR_LOCK_TASK);
  if (pr != (fio_protocol_s *)0x0) {
    (**(code **)((long)pvVar2 + 0x18))(pvVar1);
    fio_protocol_unlock(pr,FIO_PR_LOCK_TASK);
    return;
  }
  piVar3 = __errno_location();
  if (*piVar3 == 9) {
    return;
  }
  fio_message_defer(msg);
  return;
}

Assistant:

static void http_sse_on_message(fio_msg_s *msg) {
  http_sse_internal_s *sse = msg->udata1;
  struct http_sse_subscribe_args *args = msg->udata2;
  /* perform a callback */
  fio_protocol_s *pr = fio_protocol_try_lock(sse->uuid, FIO_PR_LOCK_TASK);
  if (!pr)
    goto postpone;
  args->on_message(&sse->sse, msg->channel, msg->msg, args->udata);
  fio_protocol_unlock(pr, FIO_PR_LOCK_TASK);
  return;
postpone:
  if (errno == EBADF)
    return;
  fio_message_defer(msg);
  return;
}